

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.c
# Opt level: O0

int main(void)

{
  bool bVar1;
  _Bool _Var2;
  size_t addr_err_max;
  size_t desc_err_max;
  size_t addr_list_max;
  size_t addr_max;
  size_t desc_depth_max;
  size_t desc_max;
  size_t miniscript_tr_max;
  size_t miniscript_max;
  size_t miniscript_ref_max;
  size_t index;
  _Bool tests_ok;
  
  bVar1 = true;
  for (miniscript_ref_max = 0; miniscript_ref_max < 0x1d;
      miniscript_ref_max = miniscript_ref_max + 1) {
    _Var2 = check_parse_miniscript
                      (g_miniscript_ref_test_table[miniscript_ref_max].miniscript,
                       g_miniscript_ref_test_table[miniscript_ref_max].miniscript,
                       g_miniscript_ref_test_table[miniscript_ref_max].scriptpubkey,(char **)0x0,
                       (char **)0x0,0,0);
    if (!_Var2) {
      printf("[%s] test failed!\n",g_miniscript_ref_test_table[miniscript_ref_max].miniscript);
      bVar1 = false;
    }
  }
  for (miniscript_ref_max = 0; miniscript_ref_max < 0xf; miniscript_ref_max = miniscript_ref_max + 1
      ) {
    _Var2 = check_parse_miniscript
                      (g_miniscript_test_table[miniscript_ref_max].name,
                       g_miniscript_test_table[miniscript_ref_max].descriptor,
                       g_miniscript_test_table[miniscript_ref_max].scriptpubkey,(char **)0x0,
                       (char **)0x0,0,0);
    if (!_Var2) {
      printf("[%s] test failed!\n",g_miniscript_test_table[miniscript_ref_max].name);
      bVar1 = false;
    }
  }
  for (miniscript_ref_max = 0; miniscript_ref_max < 3; miniscript_ref_max = miniscript_ref_max + 1)
  {
    _Var2 = check_parse_miniscript
                      (g_miniscript_taproot_test_table[miniscript_ref_max].miniscript,
                       g_miniscript_taproot_test_table[miniscript_ref_max].miniscript,
                       g_miniscript_taproot_test_table[miniscript_ref_max].scriptpubkey,(char **)0x0
                       ,(char **)0x0,0,g_miniscript_taproot_test_table[miniscript_ref_max].flags);
    if (!_Var2) {
      printf("[%s] test failed!\n",g_miniscript_taproot_test_table[miniscript_ref_max].miniscript);
      bVar1 = false;
    }
  }
  for (miniscript_ref_max = 0; miniscript_ref_max < 0x1f;
      miniscript_ref_max = miniscript_ref_max + 1) {
    _Var2 = check_descriptor_to_scriptpubkey
                      (g_descriptor_test_table[miniscript_ref_max].name,
                       g_descriptor_test_table[miniscript_ref_max].descriptor,
                       g_descriptor_test_table[miniscript_ref_max].scriptpubkey,
                       g_descriptor_test_table[miniscript_ref_max].bip32_index,
                       g_descriptor_test_table[miniscript_ref_max].checksum);
    if (!_Var2) {
      printf("[%s] test failed!\n",g_descriptor_test_table[miniscript_ref_max].name);
      bVar1 = false;
    }
  }
  for (miniscript_ref_max = 0; miniscript_ref_max < 7; miniscript_ref_max = miniscript_ref_max + 1)
  {
    _Var2 = check_descriptor_to_scriptpubkey_depth
                      (g_descriptor_depth_test_table[miniscript_ref_max].name,
                       g_descriptor_depth_test_table[miniscript_ref_max].descriptor,
                       g_descriptor_depth_test_table[miniscript_ref_max].depth,
                       g_descriptor_depth_test_table[miniscript_ref_max].index,
                       g_descriptor_depth_test_table[miniscript_ref_max].scriptpubkey);
    if (!_Var2) {
      printf("[%s] keylist test failed!\n",g_descriptor_depth_test_table[miniscript_ref_max].name);
      bVar1 = false;
    }
  }
  for (miniscript_ref_max = 0; miniscript_ref_max < 0x1e;
      miniscript_ref_max = miniscript_ref_max + 1) {
    _Var2 = check_descriptor_to_address
                      (g_descriptor_address_test_table[miniscript_ref_max].name,
                       g_descriptor_address_test_table[miniscript_ref_max].descriptor,
                       g_descriptor_address_test_table[miniscript_ref_max].bip32_index,
                       g_descriptor_address_test_table[miniscript_ref_max].network,
                       g_descriptor_address_test_table[miniscript_ref_max].address);
    if (!_Var2) {
      printf("[%s] test failed!\n",g_descriptor_address_test_table[miniscript_ref_max].name);
      bVar1 = false;
    }
  }
  for (miniscript_ref_max = 0; miniscript_ref_max < 2; miniscript_ref_max = miniscript_ref_max + 1)
  {
    _Var2 = check_descriptor_to_addresses
                      (g_descriptor_addresses_test_table[miniscript_ref_max].name,
                       g_descriptor_addresses_test_table[miniscript_ref_max].descriptor,
                       g_descriptor_addresses_test_table[miniscript_ref_max].start_index,
                       g_descriptor_addresses_test_table[miniscript_ref_max].end_index,
                       g_descriptor_addresses_test_table[miniscript_ref_max].network,
                       g_descriptor_addresses_test_table[miniscript_ref_max].address_list,
                       g_descriptor_addresses_test_table[miniscript_ref_max].address_list_num);
    if (!_Var2) {
      printf("[%s] test failed!\n",g_descriptor_addresses_test_table[miniscript_ref_max].name);
      bVar1 = false;
    }
  }
  for (miniscript_ref_max = 0; miniscript_ref_max < 0x12;
      miniscript_ref_max = miniscript_ref_max + 1) {
    _Var2 = check_descriptor_scriptpubkey_error
                      (g_descriptor_err_test_table[miniscript_ref_max].name,
                       g_descriptor_err_test_table[miniscript_ref_max].descriptor,
                       g_descriptor_err_test_table[miniscript_ref_max].network);
    if (!_Var2) {
      printf("[%s] test failed!\n",g_descriptor_err_test_table[miniscript_ref_max].name);
      bVar1 = false;
    }
  }
  for (miniscript_ref_max = 0; miniscript_ref_max < 5; miniscript_ref_max = miniscript_ref_max + 1)
  {
    _Var2 = check_descriptor_address_error
                      (g_address_err_test_table[miniscript_ref_max].name,
                       g_address_err_test_table[miniscript_ref_max].descriptor,
                       g_address_err_test_table[miniscript_ref_max].network);
    if (!_Var2) {
      printf("[%s] test failed!\n",g_address_err_test_table[miniscript_ref_max].name);
      bVar1 = false;
    }
  }
  return (uint)!bVar1;
}

Assistant:

int main(void)
{
    bool tests_ok = true;
    size_t index;
    size_t miniscript_ref_max = sizeof(g_miniscript_ref_test_table) / sizeof(struct wally_miniscript_ref_test);
    size_t miniscript_max = sizeof(g_miniscript_test_table) / sizeof(struct wally_miniscript_test);
    size_t miniscript_tr_max = sizeof(g_miniscript_taproot_test_table) / sizeof(struct wally_miniscript_taproot_test);
    size_t desc_max = sizeof(g_descriptor_test_table) / sizeof(struct wally_descriptor_test);
    size_t desc_depth_max = sizeof(g_descriptor_depth_test_table) / sizeof(struct wally_descriptor_depth_test);
    size_t addr_max = sizeof(g_descriptor_address_test_table) / sizeof(struct wally_descriptor_address_test);
    size_t addr_list_max = sizeof(g_descriptor_addresses_test_table) / sizeof(struct wally_descriptor_address_list_test);
    size_t desc_err_max = sizeof(g_descriptor_err_test_table) / sizeof(struct wally_descriptor_err_test);
    size_t addr_err_max = sizeof(g_address_err_test_table) / sizeof(struct wally_descriptor_err_test);

    for (index = 0; index < miniscript_ref_max; ++index) {
        if (!check_parse_miniscript(
                g_miniscript_ref_test_table[index].miniscript,
                g_miniscript_ref_test_table[index].miniscript,
                g_miniscript_ref_test_table[index].scriptpubkey,
                NULL, NULL, 0, 0)) {
            printf("[%s] test failed!\n", g_miniscript_ref_test_table[index].miniscript);
            tests_ok = false;
        }
    }

    for (index = 0; index < miniscript_max; ++index) {
        if (!check_parse_miniscript(
                g_miniscript_test_table[index].name,
                g_miniscript_test_table[index].descriptor,
                g_miniscript_test_table[index].scriptpubkey,
                NULL, NULL, 0, 0)) {
            printf("[%s] test failed!\n", g_miniscript_test_table[index].name);
            tests_ok = false;
        }
    }

    for (index = 0; index < miniscript_tr_max; ++index) {
        if (!check_parse_miniscript(
                g_miniscript_taproot_test_table[index].miniscript,
                g_miniscript_taproot_test_table[index].miniscript,
                g_miniscript_taproot_test_table[index].scriptpubkey,
                NULL, NULL, 0,
                g_miniscript_taproot_test_table[index].flags)) {
            printf("[%s] test failed!\n", g_miniscript_taproot_test_table[index].miniscript);
            tests_ok = false;
        }
    }

    for (index = 0; index < desc_max; ++index) {
        if (!check_descriptor_to_scriptpubkey(
                g_descriptor_test_table[index].name,
                g_descriptor_test_table[index].descriptor,
                g_descriptor_test_table[index].scriptpubkey,
                g_descriptor_test_table[index].bip32_index,
                g_descriptor_test_table[index].checksum)) {
            printf("[%s] test failed!\n", g_descriptor_test_table[index].name);
            tests_ok = false;
        }
    }

    for (index = 0; index < desc_depth_max; ++index) {
        if (!check_descriptor_to_scriptpubkey_depth(
                g_descriptor_depth_test_table[index].name,
                g_descriptor_depth_test_table[index].descriptor,
                g_descriptor_depth_test_table[index].depth,
                g_descriptor_depth_test_table[index].index,
                g_descriptor_depth_test_table[index].scriptpubkey)) {
            printf("[%s] keylist test failed!\n", g_descriptor_depth_test_table[index].name);
            tests_ok = false;
        }
    }

    for (index = 0; index < addr_max; ++index) {
        if (!check_descriptor_to_address(
                g_descriptor_address_test_table[index].name,
                g_descriptor_address_test_table[index].descriptor,
                g_descriptor_address_test_table[index].bip32_index,
                g_descriptor_address_test_table[index].network,
                g_descriptor_address_test_table[index].address)) {
            printf("[%s] test failed!\n", g_descriptor_address_test_table[index].name);
            tests_ok = false;
        }
    }

    for (index = 0; index < addr_list_max; ++index) {
        if (!check_descriptor_to_addresses(
                g_descriptor_addresses_test_table[index].name,
                g_descriptor_addresses_test_table[index].descriptor,
                g_descriptor_addresses_test_table[index].start_index,
                g_descriptor_addresses_test_table[index].end_index,
                g_descriptor_addresses_test_table[index].network,
                g_descriptor_addresses_test_table[index].address_list,
                g_descriptor_addresses_test_table[index].address_list_num)) {
            printf("[%s] test failed!\n", g_descriptor_addresses_test_table[index].name);
            tests_ok = false;
        }
    }

    for (index = 0; index < desc_err_max; ++index) {
        if (!check_descriptor_scriptpubkey_error(
                g_descriptor_err_test_table[index].name,
                g_descriptor_err_test_table[index].descriptor,
                g_descriptor_err_test_table[index].network)) {
            printf("[%s] test failed!\n", g_descriptor_err_test_table[index].name);
            tests_ok = false;
        }
    }

    for (index = 0; index < addr_err_max; ++index) {
        if (!check_descriptor_address_error(
                g_address_err_test_table[index].name,
                g_address_err_test_table[index].descriptor,
                g_address_err_test_table[index].network)) {
            printf("[%s] test failed!\n", g_address_err_test_table[index].name);
            tests_ok = false;
        }
    }

    return tests_ok ? 0 : 1;
}